

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::Generate
          (EnumLiteGenerator *this,Printer *printer)

{
  Printer *printer_00;
  Context *context;
  EnumDescriptor *pEVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  string **ppsVar4;
  bool bVar5;
  int iVar6;
  Options *pOVar7;
  EnumOptions *this_00;
  EnumValueDescriptor *pEVar8;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar9;
  EnumValueOptions *pEVar10;
  char *pcVar11;
  reference ppEVar12;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  undefined1 in_R8B;
  string_view sVar13;
  string_view local_710;
  string_view local_700;
  string_view local_6f0;
  string_view local_6e0;
  string_view local_6d0;
  string_view local_6c0;
  string_view local_6b0;
  string_view local_6a0;
  string_view local_690;
  string_view local_680;
  string_view local_670;
  string_view local_660;
  AlphaNum local_650;
  string local_620;
  string_view local_600;
  string_view local_5f0;
  EnumValueDescriptor *local_5e0;
  EnumValueDescriptor *value_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *__range3_2;
  string_view local_5b0;
  string_view local_5a0;
  string_view local_590;
  string_view local_580;
  string_view local_570;
  string_view local_560;
  string_view local_550;
  string_view local_540;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_528;
  string_view local_520;
  string_view local_510;
  string_view local_500;
  Options local_4f0;
  AlphaNum local_4a0;
  string local_470;
  allocator<char> local_449;
  string_view local_448;
  string local_438 [32];
  undefined1 local_418 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_2;
  int i;
  string_view local_3e8;
  string_view local_3d8;
  Options local_3c8;
  allocator<char> local_371;
  string_view local_370;
  string local_360 [39];
  allocator<char> local_339;
  string_view local_338;
  string local_328 [39];
  allocator<char> local_301;
  string_view local_300;
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  Alias *alias;
  iterator __end3_1;
  iterator __begin3_1;
  vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  *__range3_1;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_278;
  string_view local_270;
  string_view local_260;
  string_view local_250;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_238;
  string_view local_230;
  string_view local_220;
  string_view local_210;
  Options local_200;
  AlphaNum local_1b0;
  string local_180;
  allocator<char> local_159;
  string_view local_158;
  string local_148 [32];
  undefined1 local_128 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  EnumValueDescriptor *value;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *__range3;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_e0;
  string_view local_d8;
  char *local_c8;
  string_view local_c0;
  string_view local_b0;
  allocator<char> local_99;
  string local_98;
  EnumDescriptor local_68;
  Printer *printer_local;
  EnumLiteGenerator *this_local;
  
  printer_00 = (Printer *)this->descriptor_;
  local_68.reserved_names_ = (string **)printer;
  printer_local = (Printer *)this;
  pOVar7 = Context::options(this->context_);
  Options::Options((Options *)&local_68,pOVar7);
  WriteEnumDocComment((java *)printer,printer_00,&local_68,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)&local_68);
  ppsVar4 = local_68.reserved_names_;
  context = this->context_;
  pEVar1 = this->descriptor_;
  bVar5 = this->immutable_api_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,anon_var_dwarf_37cdd0 + 5,&local_99);
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,(Printer *)ppsVar4,pEVar1,(bool)(bVar5 & 1),&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,
             "$deprecation$public enum $classname$\n    implements com.google.protobuf.Internal.EnumLite {\n"
            );
  local_c0 = EnumDescriptor::name(this->descriptor_);
  this_00 = EnumDescriptor::options(this->descriptor_);
  bVar5 = EnumOptions::deprecated(this_00);
  local_c8 = anon_var_dwarf_37cdd0 + 5;
  if (bVar5) {
    local_c8 = "@java.lang.Deprecated ";
  }
  protobuf::io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],char_const*>
            ((Printer *)ppsVar4,local_b0,(char (*) [10])0x1fb9081,&local_c0,
             (char (*) [12])"deprecation",&local_c8);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"classname");
  pEVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_e0);
  protobuf::io::Printer::Annotate<google::protobuf::EnumDescriptor>
            ((Printer *)ppsVar4,local_d8,pEVar1,local_e0);
  protobuf::io::Printer::Indent((Printer *)local_68.reserved_names_);
  __end3 = std::
           vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::begin(&this->canonical_values_);
  value = (EnumValueDescriptor *)
          std::
          vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::end(&this->canonical_values_);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
                                *)&value);
    if (!bVar5) break;
    ppEVar12 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
               ::operator*(&__end3);
    vars.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)*ppEVar12;
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_128);
    sVar13 = EnumValueDescriptor::name
                       ((EnumValueDescriptor *)
                        vars.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.slot_array);
    local_158 = sVar13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_148,&local_158,&local_159);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_128,(key_arg<char[5]> *)0x1d1c66d);
    std::__cxx11::string::operator=((string *)pbVar9,local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_159);
    iVar6 = EnumValueDescriptor::number
                      ((EnumValueDescriptor *)
                       vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.slot_array);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1b0,iVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_180,(lts_20250127 *)&local_1b0,a);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_128,(key_arg<char[7]> *)0x1ddb344);
    std::__cxx11::string::operator=((string *)pbVar9,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    ppsVar4 = local_68.reserved_names_;
    uVar3 = vars.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    pOVar7 = Context::options(this->context_);
    Options::Options(&local_200,pOVar7);
    WriteEnumValueDocComment((Printer *)ppsVar4,(EnumValueDescriptor *)uVar3,&local_200);
    Options::~Options(&local_200);
    pEVar10 = EnumValueDescriptor::options
                        ((EnumValueDescriptor *)
                         vars.
                         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array);
    bVar5 = EnumValueOptions::deprecated(pEVar10);
    ppsVar4 = local_68.reserved_names_;
    if (bVar5) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_210,"@java.lang.Deprecated\n");
      protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_210);
    }
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_220,"$name$($number$),\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)ppsVar4,
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_128,local_220);
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,"name");
    uVar3 = vars.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_238);
    protobuf::io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)ppsVar4,local_230,(EnumValueDescriptor *)uVar3,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_238);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_128);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  bVar5 = EnumDescriptor::is_closed(this->descriptor_);
  ppsVar4 = local_68.reserved_names_;
  if (!bVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_250,"${$UNRECOGNIZED$}$(-1),\n");
    protobuf::io::Printer::Print<char[2],char[1],char[2],char[1]>
              ((Printer *)ppsVar4,local_250,(char (*) [2])0x1e6fede,
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),(char (*) [2])0x1e7e13f,
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5));
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_260,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_270,"}");
    pEVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_278);
    protobuf::io::Printer::Annotate<google::protobuf::EnumDescriptor>
              ((Printer *)ppsVar4,local_260,local_270,pEVar1,local_278);
  }
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_1,";\n\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,___range3_1);
  __end3_1 = std::
             vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
             ::begin(&this->aliases_);
  alias = (Alias *)std::
                   vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                   ::end(&this->aliases_);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end3_1,
                       (__normal_iterator<google::protobuf::compiler::java::EnumLiteGenerator::Alias_*,_std::vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>_>
                        *)&alias);
    if (!bVar5) break;
    vars_1.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.slot_array =
         (MaybeInitializedPtr)
         __gnu_cxx::
         __normal_iterator<google::protobuf::compiler::java::EnumLiteGenerator::Alias_*,_std::vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>_>
         ::operator*(&__end3_1);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2d0);
    sVar13 = EnumDescriptor::name(this->descriptor_);
    local_300 = sVar13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_2f0,&local_300,&local_301);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_2d0,(key_arg<char[10]> *)0x1fb9081);
    std::__cxx11::string::operator=((string *)pbVar9,local_2f0);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_301);
    sVar13 = EnumValueDescriptor::name
                       (*(EnumValueDescriptor **)
                         vars_1.
                         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array);
    local_338 = sVar13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_328,&local_338,&local_339);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_2d0,(key_arg<char[5]> *)0x1d1c66d);
    std::__cxx11::string::operator=((string *)pbVar9,local_328);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator(&local_339);
    sVar13 = EnumValueDescriptor::name
                       (*(EnumValueDescriptor **)
                         ((long)vars_1.
                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                .
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_.heap.slot_array + 8));
    local_370 = sVar13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_360,&local_370,&local_371);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[15],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_2d0,(key_arg<char[15]> *)"canonical_name");
    std::__cxx11::string::operator=((string *)pbVar9,local_360);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator(&local_371);
    ppsVar4 = local_68.reserved_names_;
    pEVar8 = *(EnumValueDescriptor **)
              vars_1.
              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
    pOVar7 = Context::options(this->context_);
    Options::Options(&local_3c8,pOVar7);
    WriteEnumValueDocComment((Printer *)ppsVar4,pEVar8,&local_3c8);
    Options::~Options(&local_3c8);
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3d8,"public static final $classname$ $name$ = $canonical_name$;\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)ppsVar4,
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2d0,local_3d8);
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e8,"name");
    pEVar8 = *(EnumValueDescriptor **)
              vars_1.
              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&i);
    protobuf::io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)ppsVar4,local_3e8,pEVar8,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)_i);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2d0);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::java::EnumLiteGenerator::Alias_*,_std::vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>_>
    ::operator++(&__end3_1);
  }
  vars_2.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_._8_4_ = 0;
  while( true ) {
    uVar2 = vars_2.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_._8_4_;
    iVar6 = EnumDescriptor::value_count(this->descriptor_);
    ppsVar4 = local_68.reserved_names_;
    if (iVar6 <= (int)uVar2) break;
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_418);
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        vars_2.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._8_4_);
    sVar13 = EnumValueDescriptor::name(pEVar8);
    local_448 = sVar13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_438,&local_448,&local_449);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_418,(key_arg<char[5]> *)0x1d1c66d);
    std::__cxx11::string::operator=((string *)pbVar9,local_438);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator(&local_449);
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        vars_2.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._8_4_);
    iVar6 = EnumValueDescriptor::number(pEVar8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4a0,iVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_470,(lts_20250127 *)&local_4a0,a_00);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_418,(key_arg<char[7]> *)0x1ddb344);
    std::__cxx11::string::operator=((string *)pbVar9,(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_418,(key_arg<char[2]> *)0x1e6fede);
    std::__cxx11::string::operator=((string *)pbVar9,anon_var_dwarf_37cdd0 + 5);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_418,(key_arg<char[2]> *)0x1e7e13f);
    std::__cxx11::string::operator=((string *)pbVar9,anon_var_dwarf_37cdd0 + 5);
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        vars_2.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._8_4_);
    pEVar10 = EnumValueDescriptor::options(pEVar8);
    bVar5 = EnumValueOptions::deprecated(pEVar10);
    pcVar11 = anon_var_dwarf_37cdd0 + 5;
    if (bVar5) {
      pcVar11 = "@java.lang.Deprecated ";
    }
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_418,(key_arg<char[12]> *)"deprecation");
    std::__cxx11::string::operator=((string *)pbVar9,pcVar11);
    ppsVar4 = local_68.reserved_names_;
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        vars_2.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._8_4_);
    pOVar7 = Context::options(this->context_);
    Options::Options(&local_4f0,pOVar7);
    WriteEnumValueDocComment((Printer *)ppsVar4,pEVar8,&local_4f0);
    Options::~Options(&local_4f0);
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_500,"$deprecation$public static final int ${$$name$_VALUE$}$ = $number$;\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)ppsVar4,
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_418,local_500);
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_510,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_520,"}");
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        vars_2.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._8_4_);
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_528);
    protobuf::io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)ppsVar4,local_510,local_520,pEVar8,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_528);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_418);
    vars_2.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_._8_4_ =
         vars_2.
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         heap_or_soo_._8_4_ + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_540,"\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_540);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_550,"\n@java.lang.Override\npublic final int getNumber() {\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_550);
  bVar5 = EnumDescriptor::is_closed(this->descriptor_);
  ppsVar4 = local_68.reserved_names_;
  if (!bVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_560,
               "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
              );
    protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_560);
  }
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_570,"  return value;\n}\n\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_570);
  pOVar7 = Context::options(this->context_);
  ppsVar4 = local_68.reserved_names_;
  if ((pOVar7->opensource_runtime & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_580,
               "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\n"
              );
    local_590 = EnumDescriptor::name(this->descriptor_);
    protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              ((Printer *)ppsVar4,local_580,(char (*) [10])0x1fb9081,&local_590);
  }
  pOVar7 = Context::options(this->context_);
  ppsVar4 = local_68.reserved_names_;
  if ((pOVar7->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5a0,"@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_5a0);
  }
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5b0,"public static $classname$ forNumber(int value) {\n  switch (value) {\n");
  ___range3_2 = EnumDescriptor::name(this->descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)ppsVar4,local_5b0,(char (*) [10])0x1fb9081,
             (basic_string_view<char,_std::char_traits<char>_> *)&__range3_2);
  protobuf::io::Printer::Indent((Printer *)local_68.reserved_names_);
  protobuf::io::Printer::Indent((Printer *)local_68.reserved_names_);
  __end3_2 = std::
             vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ::begin(&this->canonical_values_);
  value_1 = (EnumValueDescriptor *)
            std::
            vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ::end(&this->canonical_values_);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end3_2,
                       (__normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
                        *)&value_1);
    if (!bVar5) break;
    ppEVar12 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
               ::operator*(&__end3_2);
    ppsVar4 = local_68.reserved_names_;
    local_5e0 = *ppEVar12;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5f0,"case $number$: return $name$;\n");
    local_600 = EnumValueDescriptor::name(local_5e0);
    iVar6 = EnumValueDescriptor::number(local_5e0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_650,iVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_620,(lts_20250127 *)&local_650,a_01);
    protobuf::io::Printer::
    Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[7],std::__cxx11::string>
              ((Printer *)ppsVar4,local_5f0,(char (*) [5])0x1d1c66d,&local_600,
               (char (*) [7])0x1ddb344,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::EnumValueDescriptor_**,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
    ::operator++(&__end3_2);
  }
  protobuf::io::Printer::Outdent((Printer *)local_68.reserved_names_);
  protobuf::io::Printer::Outdent((Printer *)local_68.reserved_names_);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_660,
             "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        @java.lang.Override\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\npublic static com.google.protobuf.Internal.EnumVerifier \n    internalGetVerifier() {\n  return $classname$Verifier.INSTANCE;\n}\n\nprivate static final class $classname$Verifier implements \n     com.google.protobuf.Internal.EnumVerifier { \n        static final com.google.protobuf.Internal.EnumVerifier\n            INSTANCE = new $classname$Verifier();\n        @java.lang.Override\n        public boolean isInRange(int number) {\n          return $classname$.forNumber(number) != null;\n        }\n      };\n\n"
            );
  local_670 = EnumDescriptor::name(this->descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)ppsVar4,local_660,(char (*) [10])0x1fb9081,&local_670);
  pOVar7 = Context::options(this->context_);
  ppsVar4 = local_68.reserved_names_;
  if ((pOVar7->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_680,
               "/**\n * Override of toString that prints the number and name.\n * This is primarily intended as a developer aid.\n *\n * <p>NOTE: This implementation is liable to change in the future,\n * and should not be relied on in code.\n */\n@java.lang.Override\npublic java.lang.String toString() {\n  StringBuilder result = new StringBuilder(\"<\");\n  result.append(getClass().getName()).append(\'@\')\n      .append(java.lang.Integer.toHexString(\n        java.lang.System.identityHashCode(this)));\n"
              );
    protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_680);
    bVar5 = EnumDescriptor::is_closed(this->descriptor_);
    ppsVar4 = local_68.reserved_names_;
    if (bVar5) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_6a0,"  result.append(\" number=\").append(getNumber());\n");
      protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_6a0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_690,
                 "  if (this != UNRECOGNIZED) {\n    result.append(\" number=\").append(getNumber());\n  }\n"
                );
      protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_690);
    }
    ppsVar4 = local_68.reserved_names_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_6b0,
               "  return result.append(\" name=\")\n      .append(name()).append(\'>\').toString();\n}\n\n"
              );
    protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_6b0);
  }
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c0,"private final int value;\n\nprivate $classname$(int value) {\n");
  local_6d0 = EnumDescriptor::name(this->descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)ppsVar4,local_6c0,(char (*) [10])0x1fb9081,&local_6d0);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6e0,"  this.value = value;\n}\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_6e0);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6f0,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n");
  local_700 = EnumDescriptor::full_name(this->descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)ppsVar4,local_6f0,(char (*) [10])0x208afb9,&local_700);
  protobuf::io::Printer::Outdent((Printer *)local_68.reserved_names_);
  ppsVar4 = local_68.reserved_names_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_710,"}\n\n");
  protobuf::io::Printer::Print<>((Printer *)ppsVar4,local_710);
  return;
}

Assistant:

void EnumLiteGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);


  printer->Print(
      "$deprecation$public enum $classname$\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n",
      "classname", descriptor_->name(), "deprecation",
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "");
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(value->name());
    vars["number"] = absl::StrCat(value->number());
    WriteEnumValueDocComment(printer, value, context_->options());
    if (value->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    printer->Print(vars, "$name$($number$),\n");
    printer->Annotate("name", value);
  }

  if (!descriptor_->is_closed()) {
    printer->Print("${$UNRECOGNIZED$}$(-1),\n", "{", "", "}", "");
    printer->Annotate("{", "}", descriptor_);
  }

  printer->Print(
      ";\n"
      "\n");

  // -----------------------------------------------------------------

  for (const Alias& alias : aliases_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["classname"] = std::string(descriptor_->name());
    vars["name"] = std::string(alias.value->name());
    vars["canonical_name"] = std::string(alias.canonical_value->name());
    WriteEnumValueDocComment(printer, alias.value, context_->options());
    printer->Print(
        vars, "public static final $classname$ $name$ = $canonical_name$;\n");
    printer->Annotate("name", alias.value);
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(descriptor_->value(i)->name());
    vars["number"] = absl::StrCat(descriptor_->value(i)->number());
    vars["{"] = "";
    vars["}"] = "";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated()
                              ? "@java.lang.Deprecated "
                              : "";
    WriteEnumValueDocComment(printer, descriptor_->value(i),
                             context_->options());
    printer->Print(vars,
                   "$deprecation$public static final int ${$$name$_VALUE$}$ = "
                   "$number$;\n");
    printer->Annotate("{", "}", descriptor_->value(i));
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "@java.lang.Override\n"
      "public final int getNumber() {\n");
  if (!descriptor_->is_closed()) {
    printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n");
  if (context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $classname$ valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n",
        "classname", descriptor_->name());
  }

  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
  }
  printer->Print(
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    printer->Print("case $number$: return $name$;\n", "name", value->name(),
                   "number", absl::StrCat(value->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
      "    internalGetValueMap() {\n"
      "  return internalValueMap;\n"
      "}\n"
      "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
      "    $classname$> internalValueMap =\n"
      "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
      "        @java.lang.Override\n"
      "        public $classname$ findValueByNumber(int number) {\n"
      "          return $classname$.forNumber(number);\n"
      "        }\n"
      "      };\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumVerifier \n"
      "    internalGetVerifier() {\n"
      "  return $classname$Verifier.INSTANCE;\n"
      "}\n"
      "\n"
      "private static final class $classname$Verifier implements \n"
      "     com.google.protobuf.Internal.EnumVerifier { \n"
      "        static final com.google.protobuf.Internal.EnumVerifier\n"
      "            INSTANCE = new $classname$Verifier();\n"
      "        @java.lang.Override\n"
      "        public boolean isInRange(int number) {\n"
      "          return $classname$.forNumber(number) != null;\n"
      "        }\n"
      "      };\n"
      "\n",
      "classname", descriptor_->name());
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * Override of toString that prints the number and name.\n"
        " * This is primarily intended as a developer aid.\n"
        " *\n"
        " * <p>NOTE: This implementation is liable to change in the future,\n"
        " * and should not be relied on in code.\n"
        " */\n"
        "@java.lang.Override\n"
        "public java.lang.String toString() {\n"
        "  StringBuilder result = new StringBuilder(\"<\");\n"
        "  result.append(getClass().getName()).append('@')\n"
        "      .append(java.lang.Integer.toHexString(\n"
        "        java.lang.System.identityHashCode(this)));\n");
    if (!descriptor_->is_closed()) {
      printer->Print(
          "  if (this != UNRECOGNIZED) {\n"
          "    result.append(\" number=\").append(getNumber());\n"
          "  }\n");
    } else {
      printer->Print("  result.append(\" number=\").append(getNumber());\n");
    }
    printer->Print(
        "  return result.append(\" name=\")\n"
        "      .append(name()).append('>').toString();\n"
        "}\n"
        "\n");
  }

  printer->Print(
      "private final int value;\n\n"
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  printer->Print(
      "  this.value = value;\n"
      "}\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}